

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::formatNode(TaggerImpl *this,Node *node,char *out,size_t len)

{
  Lattice *pLVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Lattice *pLVar5;
  
  pLVar5 = (this->lattice_).ptr_;
  if (pLVar5 == (Lattice *)0x0) {
    iVar3 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar5 = (Lattice *)CONCAT44(extraout_var,iVar3);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar5;
  }
  iVar3 = (*pLVar5->_vptr_Lattice[0x1c])(pLVar5,node,out,len);
  if ((char *)CONCAT44(extraout_var_00,iVar3) == (char *)0x0) {
    pLVar5 = (this->lattice_).ptr_;
    if (pLVar5 == (Lattice *)0x0) {
      iVar4 = (*(this->current_model_->super_Model)._vptr_Model[4])();
      pLVar5 = (Lattice *)CONCAT44(extraout_var_01,iVar4);
      pLVar1 = (this->lattice_).ptr_;
      if (pLVar1 != (Lattice *)0x0) {
        (*pLVar1->_vptr_Lattice[0x27])();
      }
      (this->lattice_).ptr_ = pLVar5;
    }
    iVar4 = (*pLVar5->_vptr_Lattice[0x24])(pLVar5);
    pcVar2 = (char *)(this->what_)._M_string_length;
    strlen((char *)CONCAT44(extraout_var_02,iVar4));
    std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar2,CONCAT44(extraout_var_02,iVar4));
  }
  return (char *)CONCAT44(extraout_var_00,iVar3);
}

Assistant:

const char* TaggerImpl::formatNode(const Node* node,
                                   char *out, size_t len) {
  const char *result = mutable_lattice()->toString(node, out, len);
  if (!result) {
    set_what(mutable_lattice()->what());
    return 0;
  }
  return result;
}